

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::initPh2ColBound(HModel *this,int firstcol,int lastcol)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  int col;
  long lVar7;
  
  if (firstcol <= lastcol) {
    pdVar2 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->workRange).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      pdVar3[firstcol + lVar7] = pdVar2[firstcol + lVar7];
      dVar1 = pdVar4[firstcol + lVar7];
      pdVar5[firstcol + lVar7] = dVar1;
      pdVar6[firstcol + lVar7] = dVar1 - pdVar3[firstcol + lVar7];
      lVar7 = lVar7 + 1;
    } while ((lastcol - firstcol) + 1 != (int)lVar7);
  }
  return;
}

Assistant:

void HModel::initPh2ColBound(int firstcol, int lastcol) {
  // Copy bounds and compute ranges
  assert(firstcol >= 0);
  assert(lastcol < numCol);
  for (int col = firstcol; col <= lastcol; col++) {
    workLower[col] = colLower[col];
    workUpper[col] = colUpper[col];
    workRange[col] = workUpper[col] - workLower[col];
  }
}